

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int getOverflowPage(BtShared *pBt,Pgno ovfl,MemPage **ppPage,Pgno *pPgnoNext)

{
  u32 *puVar1;
  Pgno PVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Pgno pgno_00;
  u32 key;
  u8 eType;
  MemPage *pPage;
  Pgno pgno;
  u32 *local_38;
  
  iVar3 = sqlite3PendingByte;
  pPage = (MemPage *)0x0;
  pgno_00 = ovfl;
  puVar1 = pPgnoNext;
  if (pBt->autoVacuum == '\0') {
LAB_0014b129:
    iVar3 = btreeGetPage(pBt,ovfl,&pPage,(uint)(ppPage == (MemPage **)0x0) * 2);
    if (iVar3 == 0) {
      key = sqlite3Get4byte(pPage->aData);
      iVar3 = 0;
      goto LAB_0014b193;
    }
  }
  else {
    do {
      do {
        local_38 = puVar1;
        uVar5 = pgno_00;
        pgno_00 = uVar5 + 1;
        PVar2 = ptrmapPageno(pBt,pgno_00);
        pPgnoNext = local_38;
        puVar1 = local_38;
      } while (pgno_00 == PVar2);
    } while (uVar5 == (uint)iVar3 / pBt->pageSize);
    key = uVar5 + 1;
    if (pBt->nPage < key) goto LAB_0014b129;
    iVar3 = ptrmapGet(pBt,key,&eType,&pgno);
    if ((iVar3 == 0) && (eType == '\x04')) {
      if (pgno == ovfl) {
        iVar3 = 0x65;
        goto LAB_0014b193;
      }
      goto LAB_0014b129;
    }
    if (iVar3 == 0) goto LAB_0014b129;
  }
  key = 0;
LAB_0014b193:
  *pPgnoNext = key;
  if (ppPage == (MemPage **)0x0) {
    releasePage(pPage);
  }
  else {
    *ppPage = pPage;
  }
  iVar4 = 0;
  if (iVar3 != 0x65) {
    iVar4 = iVar3;
  }
  return iVar4;
}

Assistant:

static int getOverflowPage(
  BtShared *pBt,               /* The database file */
  Pgno ovfl,                   /* Current overflow page number */
  MemPage **ppPage,            /* OUT: MemPage handle (may be NULL) */
  Pgno *pPgnoNext              /* OUT: Next overflow page number */
){
  Pgno next = 0;
  MemPage *pPage = 0;
  int rc = SQLITE_OK;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert(pPgnoNext);

#ifndef SQLITE_OMIT_AUTOVACUUM
  /* Try to find the next page in the overflow list using the
  ** autovacuum pointer-map pages. Guess that the next page in 
  ** the overflow list is page number (ovfl+1). If that guess turns 
  ** out to be wrong, fall back to loading the data of page 
  ** number ovfl to determine the next page number.
  */
  if( pBt->autoVacuum ){
    Pgno pgno;
    Pgno iGuess = ovfl+1;
    u8 eType;

    while( PTRMAP_ISPAGE(pBt, iGuess) || iGuess==PENDING_BYTE_PAGE(pBt) ){
      iGuess++;
    }

    if( iGuess<=btreePagecount(pBt) ){
      rc = ptrmapGet(pBt, iGuess, &eType, &pgno);
      if( rc==SQLITE_OK && eType==PTRMAP_OVERFLOW2 && pgno==ovfl ){
        next = iGuess;
        rc = SQLITE_DONE;
      }
    }
  }
#endif

  assert( next==0 || rc==SQLITE_DONE );
  if( rc==SQLITE_OK ){
    rc = btreeGetPage(pBt, ovfl, &pPage, (ppPage==0) ? PAGER_GET_READONLY : 0);
    assert( rc==SQLITE_OK || pPage==0 );
    if( rc==SQLITE_OK ){
      next = get4byte(pPage->aData);
    }
  }

  *pPgnoNext = next;
  if( ppPage ){
    *ppPage = pPage;
  }else{
    releasePage(pPage);
  }
  return (rc==SQLITE_DONE ? SQLITE_OK : rc);
}